

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

NodePtr __thiscall dh::analysis::return_stmt(analysis *this)

{
  TYPE TVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  analysis *in_RSI;
  NodePtr NVar3;
  NodePtr tmp_ptr;
  undefined1 local_79;
  undefined1 local_78 [16];
  string local_68;
  string local_48;
  
  local_78._0_4_ =
       token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  this->layer_record = 0;
  this->initFlag = false;
  *(undefined3 *)&this->field_0x5 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,char_const(&)[7],int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->current_tab,(TreeNode **)this,
             (allocator<dh::TreeNode> *)&local_79,(char (*) [7])"return",(int *)local_78);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"return","");
  match(in_RSI,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_78._0_4_ = 4;
  TreeNode::setNodeKind(*(TreeNode **)this,(int *)local_78);
  local_78._0_4_ = 6;
  TreeNode::setKind(*(TreeNode **)this,(int *)local_78);
  TVar1 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar1 != SEPOP) {
    assignment_expr((analysis *)local_78);
    TreeNode::appendChild(*(TreeNode **)this,(NodePtr *)local_78);
    if ((element_type *)local_78._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_78 + 0x10),";","");
  match(in_RSI,(string *)(local_78 + 0x10));
  _Var2._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
    _Var2._M_pi = extraout_RDX_00;
  }
  NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi
  ;
  NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::return_stmt()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in return_stmt\n";
#endif
	NodePtr ret = ::std::make_shared<TreeNode>("return",tmp->getLineno());
	match("return");
	ret->setNodeKind(NodeKind::StmtK);
	ret->setKind(StmtKind::RetK);

	if ( tmp->getType() != TYPE::SEPOP)
	{
		NodePtr tmp_ptr = expr();
		ret->appendChild(tmp_ptr);
	}
	match(";");

	return ret;
}